

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_messages_proto3.upb.h
# Opt level: O1

bool protobuf_test_messages_proto3_TestAllTypesProto3_add_repeated_int32
               (protobuf_test_messages_proto3_TestAllTypesProto3 *msg,int32_t val,upb_Arena *arena)

{
  ulong uVar1;
  size_t sVar2;
  _Bool _Var3;
  bool bVar4;
  upb_Array *array;
  upb_MiniTableField field;
  upb_MiniTableField local_38;
  
  local_38.number_dont_copy_me__upb_internal_use_only = 0x1f;
  local_38.offset_dont_copy_me__upb_internal_use_only = 0x118;
  local_38.presence = 0;
  local_38.submsg_index_dont_copy_me__upb_internal_use_only = 0xffff;
  local_38.descriptortype_dont_copy_me__upb_internal_use_only = '\x05';
  local_38.mode_dont_copy_me__upb_internal_use_only = 0xc5;
  array = upb_Message_GetOrCreateMutableArray
                    (&msg->base_dont_copy_me__upb_internal_use_only,&local_38,arena);
  if (array == (upb_Array *)0x0) {
LAB_001a991b:
    bVar4 = false;
  }
  else {
    if ((array->data_dont_copy_me__upb_internal_use_only & 4) != 0) {
      __assert_fail("!upb_Array_IsFrozen(array)",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/internal/array.h"
                    ,0x6c,
                    "bool _upb_Array_ResizeUninitialized_dont_copy_me__upb_internal_use_only(struct upb_Array *, size_t, upb_Arena *)"
                   );
    }
    sVar2 = array->size_dont_copy_me__upb_internal_use_only;
    if (arena == (upb_Arena *)0x0 && sVar2 != 0xffffffffffffffff) {
      __assert_fail("size <= array->size_dont_copy_me__upb_internal_use_only || arena",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/internal/array.h"
                    ,0x6e,
                    "bool _upb_Array_ResizeUninitialized_dont_copy_me__upb_internal_use_only(struct upb_Array *, size_t, upb_Arena *)"
                   );
    }
    uVar1 = sVar2 + 1;
    if (array->capacity_dont_copy_me__upb_internal_use_only < uVar1) {
      _Var3 = _upb_Array_Realloc_dont_copy_me__upb_internal_use_only(array,uVar1,arena);
      if (!_Var3) goto LAB_001a991b;
    }
    array->size_dont_copy_me__upb_internal_use_only = uVar1;
    uVar1 = array->data_dont_copy_me__upb_internal_use_only;
    if ((uVar1 & 4) != 0) {
      __assert_fail("!upb_Array_IsFrozen(array)",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/internal/array.h"
                    ,0x7a,
                    "void _upb_Array_Set_dont_copy_me__upb_internal_use_only(struct upb_Array *, size_t, const void *, size_t)"
                   );
    }
    if (sVar2 == 0xffffffffffffffff) {
      __assert_fail("i < array->size_dont_copy_me__upb_internal_use_only",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/internal/array.h"
                    ,0x7b,
                    "void _upb_Array_Set_dont_copy_me__upb_internal_use_only(struct upb_Array *, size_t, const void *, size_t)"
                   );
    }
    if ((((uint)uVar1 & 3) + 1) - (uint)((uVar1 & 3) == 0) != 2) {
      __assert_fail("elem_size == 1U << _upb_Array_ElemSizeLg2_dont_copy_me__upb_internal_use_only(array)"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/internal/array.h"
                    ,0x7c,
                    "void _upb_Array_Set_dont_copy_me__upb_internal_use_only(struct upb_Array *, size_t, const void *, size_t)"
                   );
    }
    *(int32_t *)((uVar1 & 0xfffffffffffffff8) + sVar2 * 4) = val;
    bVar4 = true;
  }
  return bVar4;
}

Assistant:

UPB_INLINE bool protobuf_test_messages_proto3_TestAllTypesProto3_add_repeated_int32(protobuf_test_messages_proto3_TestAllTypesProto3* msg, int32_t val, upb_Arena* arena) {
  upb_MiniTableField field = {31, UPB_SIZE(60, 280), 0, kUpb_NoSub, 5, (int)kUpb_FieldMode_Array | (int)kUpb_LabelFlags_IsPacked | ((int)UPB_SIZE(kUpb_FieldRep_4Byte, kUpb_FieldRep_8Byte) << kUpb_FieldRep_Shift)};
  upb_Array* arr = upb_Message_GetOrCreateMutableArray(
      UPB_UPCAST(msg), &field, arena);
  if (!arr || !UPB_PRIVATE(_upb_Array_ResizeUninitialized)(
                  arr, arr->UPB_PRIVATE(size) + 1, arena)) {
    return false;
  }
  UPB_PRIVATE(_upb_Array_Set)
  (arr, arr->UPB_PRIVATE(size) - 1, &val, sizeof(val));
  return true;
}